

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

presentation_type fmt::v8::detail::parse_presentation_type<char32_t>(char32_t type)

{
  switch(type) {
  case L'a':
    return hexfloat_lower;
  case L'b':
    return bin_lower;
  case L'c':
    return chr;
  case L'd':
    return dec;
  case L'e':
    return exp_lower;
  case L'f':
    return fixed_lower;
  case L'g':
    return general_lower;
  case L'h':
  case L'i':
  case L'j':
  case L'k':
  case L'l':
  case L'm':
  case L'n':
  case L'q':
  case L'r':
  case L't':
  case L'u':
  case L'v':
  case L'w':
    goto switchD_001702c3_caseD_68;
  case L'o':
    return oct;
  case L'p':
    return pointer;
  case L's':
    return string;
  case L'x':
    return hex_lower;
  default:
    switch(type) {
    case L'A':
      return hexfloat_upper;
    case L'B':
      return bin_upper;
    case L'C':
    case L'D':
      break;
    case L'E':
      return exp_upper;
    case L'F':
      return fixed_upper;
    case L'G':
      return general_upper;
    default:
      if (type == L'X') {
        return hex_upper;
      }
    }
switchD_001702c3_caseD_68:
    return none;
  }
}

Assistant:

FMT_CONSTEXPR auto parse_presentation_type(Char type) -> presentation_type {
  switch (to_ascii(type)) {
  case 'd':
    return presentation_type::dec;
  case 'o':
    return presentation_type::oct;
  case 'x':
    return presentation_type::hex_lower;
  case 'X':
    return presentation_type::hex_upper;
  case 'b':
    return presentation_type::bin_lower;
  case 'B':
    return presentation_type::bin_upper;
  case 'a':
    return presentation_type::hexfloat_lower;
  case 'A':
    return presentation_type::hexfloat_upper;
  case 'e':
    return presentation_type::exp_lower;
  case 'E':
    return presentation_type::exp_upper;
  case 'f':
    return presentation_type::fixed_lower;
  case 'F':
    return presentation_type::fixed_upper;
  case 'g':
    return presentation_type::general_lower;
  case 'G':
    return presentation_type::general_upper;
  case 'c':
    return presentation_type::chr;
  case 's':
    return presentation_type::string;
  case 'p':
    return presentation_type::pointer;
  default:
    return presentation_type::none;
  }
}